

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O3

void __thiscall QAbstractSocketPrivate::canCloseNotification(QAbstractSocketPrivate *this)

{
  long *plVar1;
  qint64 qVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->isBuffered == true) {
    if (*(long *)&this->field_0x90 == 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = *(long *)(*(long *)&this->field_0x90 + 0x18);
    }
    plVar1 = *(long **)&this->field_0x8;
    qVar2 = this->readBufferMaxSize;
    this->readBufferMaxSize = 0;
    bVar3 = readFromSocket(this);
    this->readBufferMaxSize = qVar2;
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        (**(code **)(*plVar1 + 0x100))(plVar1);
        return;
      }
      goto LAB_001bef99;
    }
    if (*(long *)&this->field_0x90 == 0) {
      lVar4 = 0;
    }
    else {
      lVar4 = *(long *)(*(long *)&this->field_0x90 + 0x18);
    }
    if (lVar4 != lVar5) {
      emitReadyRead(this,0);
      local_48 = (void *)0x0;
      pcStack_40 = (char *)0x0;
      local_38[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (&this->socketEngine->super_QObject,"closeNotification",QueuedConnection,1,&local_48
                 ,&pcStack_40,local_38);
    }
  }
  else if (((this->socketType & ~SctpSocket) == TcpSocket) &&
          (this->socketEngine != (QAbstractSocketEngine *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      emitReadyRead(this,0);
      return;
    }
    goto LAB_001bef99;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_001bef99:
  __stack_chk_fail();
}

Assistant:

void QAbstractSocketPrivate::canCloseNotification()
{
    Q_Q(QAbstractSocket);
    // Note that this method is only called on Windows. Other platforms close in the canReadNotification()

#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::canCloseNotification()");
#endif

    qint64 newBytes = 0;
    if (isBuffered) {
        // Try to read to the buffer, if the read fail we can close the socket.
        newBytes = buffer.size();
        qint64 oldReadBufferMaxSize = readBufferMaxSize;
        readBufferMaxSize = 0; // temporarily disable max read buffer, we want to empty the OS buffer
        bool hadReadFromSocket = readFromSocket();
        readBufferMaxSize = oldReadBufferMaxSize;
        if (!hadReadFromSocket) {
            q->disconnectFromHost();
            return;
        }
        newBytes = buffer.size() - newBytes;
        if (newBytes) {
            // If there was still some data to be read from the socket
            // then we could get another FD_READ. The disconnect will
            // then occur when we read from the socket again and fail
            // in canReadNotification or by the manually created
            // closeNotification below.
            emitReadyRead();

            QMetaObject::invokeMethod(socketEngine, "closeNotification", Qt::QueuedConnection);
        }
    } else if ((socketType == QAbstractSocket::TcpSocket ||
                socketType == QAbstractSocket::SctpSocket) && socketEngine) {
        emitReadyRead();
    }
}